

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_bin_bz2.c
# Opt level: O2

void test_read_format_cpio_bin_bz2(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *_a;
  archive_entry *ae;
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                   ,L'(',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar1 = archive_read_support_filter_bzip2(_a);
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                   ,L'+');
    test_skipping("bzip2 support unavailable");
    archive_read_close(_a);
    return;
  }
  iVar1 = archive_read_support_format_all(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",_a);
  iVar1 = archive_read_open_memory(_a,archive,0x62);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open_memory(a, archive, sizeof(archive))",_a);
  iVar1 = archive_read_next_header(_a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",_a);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                      ,L'3',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                      ,L'4',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",_a);
  iVar1 = archive_filter_code(_a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                   ,L'5',(uint)(iVar1 == 2),"archive_filter_code(a, 0) == ARCHIVE_FILTER_BZIP2",
                   (void *)0x0);
  iVar1 = archive_format(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                   ,L'6',(uint)(iVar1 == 0x10002),"archive_format(a) == ARCHIVE_FORMAT_CPIO_BIN_LE",
                   (void *)0x0);
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",_a);
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_bz2.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_bin_bz2)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_bzip2(a);
	if (r != ARCHIVE_OK) {
		skipping("bzip2 support unavailable");
		archive_read_close(a);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assert(archive_filter_code(a, 0) == ARCHIVE_FILTER_BZIP2);
	assert(archive_format(a) == ARCHIVE_FORMAT_CPIO_BIN_LE);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}